

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

Col_Word Col_NewRope(Col_StringFormat format,void *data,size_t byteLength)

{
  size_t sVar1;
  Col_Char4 *__n;
  Col_Word CVar2;
  Col_Word right;
  Col_Char2 *target_1;
  Col_Char1 *target;
  size_t i_1;
  Col_Char4 *string_1;
  size_t i;
  Col_Char4 *string;
  size_t codeUnits;
  char *p;
  char *source;
  size_t half;
  size_t length;
  Col_Word rope;
  size_t byteLength_local;
  void *data_local;
  Col_StringFormat format_local;
  
  if (byteLength == 0) {
    return 0xc;
  }
  rope = byteLength;
  byteLength_local = (size_t)data;
  data_local._4_4_ = format;
  if ((format & 0x10) == 0) {
    __n = (Col_Char4 *)(byteLength / (format & (COL_UCS4|COL_UCS2|COL_UCS1)));
    if (__n == (Col_Char4 *)0x1) {
      switch(format) {
      case COL_UCS1:
        return (ulong)*data << 8 | (ulong)format << 5 | 4;
      case COL_UCS2:
        return (ulong)*data << 8 | (ulong)format << 5 | 4;
      default:
        break;
      case COL_UCS4:
        return (ulong)*data << 8 | (ulong)format << 5 | 4;
      case 0x24:
        CVar2 = Col_NewCharWord(*data);
        return CVar2;
      }
    }
    else if (__n < (Col_Char4 *)0x8) {
      if (format == COL_UCS1) {
        length = (long)__n << 5 | 0xc;
        memcpy((void *)((long)&length + 1),data,(size_t)__n);
        return length;
      }
      if (format == 0x24) {
        length = (long)__n << 5 | 0xc;
        for (string_1 = (Col_Char4 *)0x0;
            (string_1 < __n && (*(uint *)((long)data + (long)string_1 * 4) < 0x100));
            string_1 = (Col_Char4 *)((long)string_1 + 1)) {
          *(char *)((long)&length + 1 + (long)string_1) =
               (char)*(undefined4 *)((long)data + (long)string_1 * 4);
        }
        if (string_1 == __n) {
          return length;
        }
      }
    }
    sVar1 = byteLength_local;
    if (__n < (Col_Char4 *)0x10000) {
      half._0_2_ = SUB82(__n,0);
      if (data_local._4_4_ == 0x24) {
        data_local._4_4_ = 1;
        for (target = (Col_Char1 *)0x0; target < __n; target = target + 1) {
          if (0xffff < *(uint *)(byteLength_local + (long)target * 4)) {
            data_local._4_4_ = 4;
            break;
          }
          if (0xff < *(uint *)(byteLength_local + (long)target * 4)) {
            data_local._4_4_ = 2;
          }
        }
        rope = (long)__n * (ulong)data_local._4_4_;
        length = (size_t)AllocCells(rope + 0x23 >> 5);
        (*(Cell *)length)[0] = '\x06';
        (*(Cell *)length)[1] = data_local._4_1_;
        *(undefined2 *)(*(Cell *)length + 2) = (undefined2)half;
        if (data_local._4_4_ == 1) {
          for (target = (Col_Char1 *)0x0; target < __n; target = target + 1) {
            (*(Cell *)length + 4)[(long)target] = (char)*(undefined4 *)(sVar1 + (long)target * 4);
          }
        }
        else if (data_local._4_4_ == 2) {
          for (target = (Col_Char1 *)0x0; target < __n; target = target + 1) {
            *(short *)(*(Cell *)length + (long)target * 2 + 4) =
                 (short)*(undefined4 *)(sVar1 + (long)target * 4);
          }
        }
        else if (data_local._4_4_ == 4) {
          memcpy(*(Cell *)length + 4,(void *)byteLength_local,rope);
        }
      }
      else {
        length = (size_t)AllocCells(rope + 0x23 >> 5);
        (*(Cell *)length)[0] = '\x06';
        (*(Cell *)length)[1] = (char)data_local._4_4_;
        *(undefined2 *)(*(Cell *)length + 2) = (undefined2)half;
        memcpy(*(Cell *)length + 4,(void *)byteLength_local,rope);
      }
      return length;
    }
    source = (char *)(((ulong)__n >> 1) * (ulong)(data_local._4_4_ & (COL_UCS4|COL_UCS2|COL_UCS1)));
  }
  else {
    if (byteLength < 0xfdb) {
      half = 0;
      codeUnits = (size_t)data;
      while (codeUnits < (long)data + rope) {
        if (data_local._4_4_ == COL_UTF8) {
          codeUnits = (size_t)Col_Utf8Next((Col_Char1 *)codeUnits);
        }
        else if (data_local._4_4_ == COL_UTF16) {
          codeUnits = (size_t)Col_Utf16Next((Col_Char2 *)codeUnits);
        }
        half = half + 1;
      }
      length = (size_t)AllocCells(rope + 0x25 >> 5);
      (*(Cell *)length)[0] = '\n';
      (*(Cell *)length)[1] = (char)data_local._4_4_;
      *(short *)(*(Cell *)length + 2) = (short)half;
      *(short *)(*(Cell *)length + 4) = (short)rope;
      memcpy(*(Cell *)length + 6,(void *)byteLength_local,rope);
      return length;
    }
    codeUnits = (long)data +
                ((byteLength / (format & (COL_UCS4|COL_UCS2|COL_UCS1)) >> 1) + 1) *
                (ulong)(format & (COL_UCS4|COL_UCS2|COL_UCS1));
    if (format == COL_UTF8) {
      codeUnits = (size_t)Col_Utf8Prev((Col_Char1 *)codeUnits);
    }
    else if (format == COL_UTF16) {
      codeUnits = (size_t)Col_Utf16Prev((Col_Char2 *)codeUnits);
    }
    source = (char *)(codeUnits - (long)data);
  }
  CVar2 = Col_NewRope(data_local._4_4_,(void *)byteLength_local,(size_t)source);
  right = Col_NewRope(data_local._4_4_,source + byteLength_local,rope - (long)source);
  CVar2 = Col_ConcatRopes(CVar2,right);
  return CVar2;
}

Assistant:

Col_Word
Col_NewRope(
    Col_StringFormat format,    /*!< Format of data in buffer. if #COL_UCS,
                                     data is provided as with #COL_UCS4 but
                                     will use #COL_UCS1 or #COL_UCS2 if data
                                     fits. */
    const void *data,           /*!< Buffer containing flat data. */
    size_t byteLength)          /*!< Length of data in bytes. */
{
    Col_Word rope;
    size_t length;
    size_t half=0;              /* Index of the split point. */

    /*
     * Quick cases.
     */

    if (byteLength == 0) {
        /* Empty string. */
        return WORD_SMALLSTR_EMPTY;
    }

    if (FORMAT_UTF(format)) {
        /*
         * Variable-width UTF-8/16 string.
         */

        const char *source = (const char *) data, *p;
        size_t codeUnits = byteLength / CHAR_WIDTH(format);
        if (byteLength <= UTFSTR_MAX_BYTELENGTH) {
            /*
             * String fits into one multi-cell leaf rope. We know the byte
             * length, now get the char length.
             */

            length = 0;
            for (p = source; p < source+byteLength; length++) {
                switch (format) {
                case COL_UTF8:  p = (const char *) Col_Utf8Next ((const Col_Char1 *) p); break;
                case COL_UTF16: p = (const char *) Col_Utf16Next((const Col_Char2 *) p); break;
                }
            }
            rope = (Col_Word) AllocCells(UTFSTR_SIZE(byteLength));
            WORD_UTFSTR_INIT(rope, format, length, byteLength);
            memcpy((void *) WORD_UTFSTR_DATA(rope), data, byteLength);
            return rope;
        }

        /*
         * Split data in half at char boundary.
         */

        p = source + (codeUnits/2 + 1) * CHAR_WIDTH(format);
        switch (format) {
        case COL_UTF8:  p = (const char *) Col_Utf8Prev ((const Col_Char1 *) p); break;
        case COL_UTF16: p = (const char *) Col_Utf16Prev((const Col_Char2 *) p); break;
        }
        half = p-source;
    } else {
        /*
         * Fixed-width UCS string.
         */

        length = byteLength / CHAR_WIDTH(format);
        if (length == 1) {
            /*
             * Single char.
             */

            switch (format) {
            case COL_UCS1: return WORD_CHAR_NEW(*(const Col_Char1 *) data, format);
            case COL_UCS2: return WORD_CHAR_NEW(*(const Col_Char2 *) data, format);
            case COL_UCS4: return WORD_CHAR_NEW(*(const Col_Char4 *) data, format);
            case COL_UCS: return Col_NewCharWord(*(const Col_Char4 *) data);
            }
        } else if (length <= SMALLSTR_MAX_LENGTH) {
            switch (format) {
            case COL_UCS1:
                /*
                 * Immediate string.
                 */

                WORD_SMALLSTR_SET_LENGTH(rope, length);
                memcpy(WORD_SMALLSTR_DATA(rope), data, length);
                return rope;

            case COL_UCS: {
                /*
                 * Use immediate string if possible.
                 */

                const Col_Char4 * string = (const Col_Char4 *) data;
                size_t i;
                WORD_SMALLSTR_SET_LENGTH(rope, length);
                for (i = 0; i < length; i++) {
                    if (string[i] > COL_CHAR1_MAX) break;
                    WORD_SMALLSTR_DATA(rope)[i] = (Col_Char1) string[i];
                }
                if (i == length) {
                    return rope;
                }
                break;
                }
            }
        }
        if (length <= UCSSTR_MAX_LENGTH) {
            /*
             * String fits into one multi-cell leaf rope.
             */

            if (format == COL_UCS) {
                /*
                 * Adaptive format.
                 */

                const Col_Char4 * string = (const Col_Char4 *) data;
                size_t i;
                format = COL_UCS1;
                for (i = 0; i < length; i++) {
                    if (string[i] > COL_CHAR2_MAX) {
                        format = COL_UCS4;
                        break;
                    } else if (string[i] > COL_CHAR1_MAX) {
                        format = COL_UCS2;
                    }
                }
                byteLength = length * CHAR_WIDTH(format);
                rope = (Col_Word) AllocCells(UCSSTR_SIZE(byteLength));
                WORD_UCSSTR_INIT(rope, format, length);
                switch (format) {
                case COL_UCS1: {
                    Col_Char1 * target
                            = (Col_Char1 *) WORD_UCSSTR_DATA(rope);
                    for (i = 0; i < length; i++) {
                        target[i] = string[i];
                    }
                    break;
                    }

                case COL_UCS2: {
                    Col_Char2 * target
                            = (Col_Char2 *) WORD_UCSSTR_DATA(rope);
                    for (i = 0; i < length; i++) {
                        target[i] = string[i];
                    }
                    break;
                    }

                case COL_UCS4:
                    memcpy((void *) WORD_UCSSTR_DATA(rope), data,
                            byteLength);
                    break;
                }
            } else {
                /*
                 * Fixed format.
                 */

                rope = (Col_Word) AllocCells(UCSSTR_SIZE(byteLength));
                WORD_UCSSTR_INIT(rope, format, length);
                memcpy((void *) WORD_UCSSTR_DATA(rope), data, byteLength);
            }
            return rope;
        }

        /*
         * Split data in half at char boundary.
         */

        half = (length/2) * CHAR_WIDTH(format);
    }

    /*
     * The rope is built by concatenating the two halves of the string. This
     * recursive halving ensures that the resulting binary tree is properly
     * balanced.
     */

    return Col_ConcatRopes(Col_NewRope(format, data, half),
            Col_NewRope(format, (const char *) data+half, byteLength-half));
}